

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdtrans.c
# Opt level: O0

void transdecode_master_selection(j_decompress_ptr cinfo)

{
  int iVar1;
  long in_RDI;
  j_decompress_ptr unaff_retaddr;
  int nscans;
  boolean in_stack_0000002c;
  j_decompress_ptr in_stack_00000030;
  undefined4 in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  *(undefined4 *)(in_RDI + 0x58) = 1;
  if (*(int *)(in_RDI + 0x13c) == 0) {
    if (*(int *)(in_RDI + 0x138) == 0) {
      jinit_huff_decoder((j_decompress_ptr)
                         CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
    }
    else {
      jinit_phuff_decoder(unaff_retaddr);
    }
  }
  else {
    jinit_arith_decoder(unaff_retaddr);
  }
  jinit_d_coef_controller(in_stack_00000030,in_stack_0000002c);
  (**(code **)(*(long *)(in_RDI + 8) + 0x30))(in_RDI);
  (**(code **)(*(long *)(in_RDI + 0x240) + 0x10))(in_RDI);
  if (*(long *)(in_RDI + 0x10) != 0) {
    if (*(int *)(in_RDI + 0x138) == 0) {
      if (*(int *)(*(long *)(in_RDI + 0x240) + 0x20) == 0) {
        iVar1 = 1;
      }
      else {
        iVar1 = *(int *)(in_RDI + 0x38);
      }
    }
    else {
      iVar1 = *(int *)(in_RDI + 0x38) * 3 + 2;
    }
    *(undefined8 *)(*(long *)(in_RDI + 0x10) + 8) = 0;
    *(ulong *)(*(long *)(in_RDI + 0x10) + 0x10) = (ulong)*(uint *)(in_RDI + 0x1a4) * (long)iVar1;
    *(undefined4 *)(*(long *)(in_RDI + 0x10) + 0x18) = 0;
    *(undefined4 *)(*(long *)(in_RDI + 0x10) + 0x1c) = 1;
  }
  return;
}

Assistant:

LOCAL(void)
transdecode_master_selection(j_decompress_ptr cinfo)
{
  /* This is effectively a buffered-image operation. */
  cinfo->buffered_image = TRUE;

#if JPEG_LIB_VERSION >= 80
  /* Compute output image dimensions and related values. */
  jpeg_core_output_dimensions(cinfo);
#endif

  /* Entropy decoding: either Huffman or arithmetic coding. */
  if (cinfo->arith_code) {
#ifdef D_ARITH_CODING_SUPPORTED
    jinit_arith_decoder(cinfo);
#else
    ERREXIT(cinfo, JERR_ARITH_NOTIMPL);
#endif
  } else {
    if (cinfo->progressive_mode) {
#ifdef D_PROGRESSIVE_SUPPORTED
      jinit_phuff_decoder(cinfo);
#else
      ERREXIT(cinfo, JERR_NOT_COMPILED);
#endif
    } else
      jinit_huff_decoder(cinfo);
  }

  /* Always get a full-image coefficient buffer. */
  jinit_d_coef_controller(cinfo, TRUE);

  /* We can now tell the memory manager to allocate virtual arrays. */
  (*cinfo->mem->realize_virt_arrays) ((j_common_ptr)cinfo);

  /* Initialize input side of decompressor to consume first scan. */
  (*cinfo->inputctl->start_input_pass) (cinfo);

  /* Initialize progress monitoring. */
  if (cinfo->progress != NULL) {
    int nscans;
    /* Estimate number of scans to set pass_limit. */
    if (cinfo->progressive_mode) {
      /* Arbitrarily estimate 2 interleaved DC scans + 3 AC scans/component. */
      nscans = 2 + 3 * cinfo->num_components;
    } else if (cinfo->inputctl->has_multiple_scans) {
      /* For a nonprogressive multiscan file, estimate 1 scan per component. */
      nscans = cinfo->num_components;
    } else {
      nscans = 1;
    }
    cinfo->progress->pass_counter = 0L;
    cinfo->progress->pass_limit = (long)cinfo->total_iMCU_rows * nscans;
    cinfo->progress->completed_passes = 0;
    cinfo->progress->total_passes = 1;
  }
}